

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CDict * ZSTD_createCDict_byReference(void *dict,size_t dictSize,int compressionLevel)

{
  ZSTD_compressionParameters cParams_00;
  ZSTD_customMem customMem;
  ZSTD_CDict *pZVar1;
  uint local_44;
  ZSTD_CDict *cdict;
  ZSTD_compressionParameters cParams;
  int compressionLevel_local;
  size_t dictSize_local;
  void *dict_local;
  
  cParams.targetLength = compressionLevel;
  unique0x10000102 = dictSize;
  ZSTD_getCParams_internal
            ((ZSTD_compressionParameters *)&cdict,compressionLevel,0xffffffffffffffff,dictSize,
             ZSTD_cpm_createCDict);
  cParams_00.hashLog = cParams.windowLog;
  cParams_00.searchLog = cParams.chainLog;
  cParams_00._0_8_ = cdict;
  cParams_00.minMatch = cParams.hashLog;
  cParams_00.targetLength = cParams.searchLog;
  cParams_00.strategy = cParams.minMatch;
  customMem.opaque = (void *)0x0;
  customMem.customAlloc = (ZSTD_allocFunction)0x0;
  customMem.customFree = (ZSTD_freeFunction)0x0;
  pZVar1 = ZSTD_createCDict_advanced
                     (dict,stack0xffffffffffffffe8,ZSTD_dlm_byRef,ZSTD_dct_auto,cParams_00,customMem
                     );
  if (pZVar1 != (ZSTD_CDict *)0x0) {
    if (cParams.targetLength == 0) {
      local_44 = 3;
    }
    else {
      local_44 = cParams.targetLength;
    }
    pZVar1->compressionLevel = local_44;
  }
  return pZVar1;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict_byReference(const void* dict, size_t dictSize, int compressionLevel)
{
    ZSTD_compressionParameters cParams = ZSTD_getCParams_internal(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    ZSTD_CDict* const cdict = ZSTD_createCDict_advanced(dict, dictSize,
                                     ZSTD_dlm_byRef, ZSTD_dct_auto,
                                     cParams, ZSTD_defaultCMem);
    if (cdict)
        cdict->compressionLevel = (compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT : compressionLevel;
    return cdict;
}